

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

int Gia_ManPerformGlaOld(Gia_Man_t *pAig,Abs_Par_t *pPars,int fStartVta)

{
  Gia_Obj_t *pGVar1;
  byte bVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  sat_solver2 *psVar5;
  Vec_Set_t *pVVar6;
  uint *__dest;
  int **ppiVar7;
  Vec_Wrd_t *__ptr;
  Gla_Obj_t *__ptr_00;
  bool bVar8;
  ABC_INT64_T AVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Gla_Man_t *pGVar14;
  Abc_Cex_t *pAVar15;
  Abs_Par_t *pAVar16;
  Gla_Man_t *pGVar17;
  Vec_Int_t *pVVar18;
  Prf_Man_t *pPVar19;
  Vec_Int_t *pVVar20;
  int *piVar21;
  Vec_Wrd_t *pVVar22;
  word *pwVar23;
  Abc_Frame_t *pAbc;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  int iVar32;
  Gla_Man_t *pGVar33;
  char *pcVar34;
  Gla_Man_t *pGVar35;
  Gia_Man_t *pGVar36;
  uint *in_R8;
  Abs_Par_t *pPars_00;
  int nFramesMaxOld;
  double dVar37;
  int Status;
  int nConfls;
  timespec ts;
  long local_478;
  int local_470;
  uint local_46c;
  double local_468;
  ulong local_460;
  int local_458;
  int local_454;
  Gia_Man_t *local_450;
  Abc_Cex_t *local_448;
  Abs_Par_t *local_440;
  ulong local_438;
  int local_430;
  int local_42c;
  Gla_Man_t *local_428;
  uint local_420;
  int local_41c;
  Vec_Int_t local_418 [62];
  
  iVar11 = clock_gettime(3,(timespec *)local_418);
  if (iVar11 < 0) {
    local_478 = -1;
  }
  else {
    local_478 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
  }
  pVVar20 = pAig->vCos;
  iVar11 = pVVar20->nSize;
  iVar32 = pAig->nRegs;
  if (iVar11 - iVar32 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x670,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  iVar29 = pPars->nFramesMax;
  if ((iVar29 != 0) && (iVar29 < pPars->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x671,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if (iVar11 <= iVar32) {
LAB_00588446:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  local_440 = pPars;
  if (iVar11 < 1) {
LAB_00588465:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar11 = *pVVar20->pArray;
  if (((long)iVar11 < 0) || (uVar12 = pAig->nObjs, (int)uVar12 <= iVar11)) {
LAB_00588427:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar4 = pAig->pObjs;
  pGVar1 = pGVar4 + iVar11;
  uVar13 = (uint)*(undefined8 *)pGVar1;
  local_450 = pAig;
  if ((~*(ulong *)(pGVar1 + -(ulong)(uVar13 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
    if ((uVar13 >> 0x1d & 1) == 0) {
      puts("Sequential miter is trivially UNSAT.");
      return 1;
    }
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pAVar15 = Abc_CexMakeTriv(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,1,0);
    pAig->pCexSeq = pAVar15;
    puts("Sequential miter is trivially SAT.");
    return 0;
  }
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    if (fStartVta == 0) {
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      uVar13 = 0x10;
      if (0xe < uVar12 - 1) {
        uVar13 = uVar12;
      }
      pVVar18->nSize = 0;
      pVVar18->nCap = uVar13;
      if (uVar13 == 0) {
        piVar21 = (int *)0x0;
      }
      else {
        piVar21 = (int *)malloc((long)(int)uVar13 << 2);
      }
      pVVar18->pArray = piVar21;
      pVVar18->nSize = uVar12;
      memset(piVar21,0,(long)(int)uVar12 << 2);
      local_450->vGateClasses = pVVar18;
      if ((int)uVar12 < 1) {
LAB_00588500:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *piVar21 = 1;
      if (pVVar20->nSize <= iVar32) goto LAB_00588446;
      if (pVVar20->nSize < 1) goto LAB_00588465;
      uVar13 = *pVVar20->pArray;
      if (uVar12 <= uVar13) goto LAB_00588427;
      if ((int)uVar12 <= (int)uVar13) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar13 = uVar13 - (*(uint *)(pGVar4 + uVar13) & 0x1fffffff);
      if (uVar12 <= uVar13) goto LAB_00588500;
      piVar21[uVar13] = 1;
      goto LAB_00586818;
    }
    iVar11 = pPars->nFramesStart;
    iVar32 = pPars->nTimeOut;
    iVar3 = pPars->fDumpVabs;
    pPars->nFramesMax = iVar11;
    iVar24 = 2;
    if (iVar11 / 2 < 2) {
      iVar24 = iVar11 / 2;
    }
    pPars->nFramesStart = iVar24 + 1;
    pPars->nTimeOut = 0x14;
    pPars->fDumpVabs = 0;
    local_458 = Gia_VtaPerformInt(pAig,pPars);
    pPars->nFramesMax = iVar29;
    pPars->nFramesStart = iVar11;
    pPars->nTimeOut = iVar32;
    pPars->fDumpVabs = iVar3;
    if (pAig->vGateClasses != (Vec_Int_t *)0x0) {
      piVar21 = pAig->vGateClasses->pArray;
      if (piVar21 != (int *)0x0) {
        free(piVar21);
        pAig->vGateClasses->pArray = (int *)0x0;
      }
      if (pAig->vGateClasses != (Vec_Int_t *)0x0) {
        free(pAig->vGateClasses);
        pAig->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
      pVVar20 = Gia_VtaConvertToGla(pAig,pAig->vObjClasses);
      pAig->vGateClasses = pVVar20;
    }
    pPars_00 = local_440;
    if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
      piVar21 = pAig->vObjClasses->pArray;
      if (piVar21 != (int *)0x0) {
        free(piVar21);
        pAig->vObjClasses->pArray = (int *)0x0;
      }
      if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
        free(pAig->vObjClasses);
        pAig->vObjClasses = (Vec_Int_t *)0x0;
      }
    }
    if (local_458 == 0) {
      return 0;
    }
    if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
      return local_458;
    }
  }
  else {
LAB_00586818:
    local_458 = -1;
    pAig = local_450;
    pPars_00 = local_440;
  }
  pGVar14 = Gla_ManStart(pAig,pPars_00);
  iVar32 = 3;
  iVar11 = clock_gettime(3,(timespec *)local_418);
  if (iVar11 < 0) {
    lVar26 = -1;
  }
  else {
    lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
  }
  pGVar14->timeInit = lVar26 - local_478;
  lVar26 = (long)pGVar14->pPars->nTimeOut;
  local_428 = pGVar14;
  if (lVar26 != 0) {
    psVar5 = pGVar14->pSat;
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (iVar11 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    psVar5->nRuntimeLimit = lVar27 + lVar26 * 1000000;
  }
  pGVar14 = local_428;
  if (local_428->pPars->fVerbose != 0) {
    Abc_Print(iVar32,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(iVar32,"FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n",
              (ulong)(uint)pPars_00->nFramesMax,(ulong)(uint)pPars_00->nConfLimit,
              (ulong)(uint)pPars_00->nTimeOut,(ulong)(uint)pPars_00->nRatioMin);
    in_R8 = (uint *)(ulong)(uint)pPars_00->nLearnedPerce;
    Abc_Print(iVar32,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pPars_00->nLearnedStart);
    Abc_Print(iVar32,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  pAVar16 = pGVar14->pPars;
  if (-1 < pAVar16->nFramesMax) {
    local_448 = (Abc_Cex_t *)0x0;
    uVar28 = 0;
    local_454 = 0;
    local_430 = 0;
    uVar12 = 0;
LAB_00586b1e:
    local_42c = (int)(pGVar14->pSat->stats).conflicts;
    iVar11 = (int)uVar28;
    pAVar16->iFrame = iVar11;
    local_420 = uVar12;
    Gia_GlaAddTimeFrame(pGVar14,iVar11);
    uVar30 = (ulong)(iVar11 + 1);
    local_46c = 0;
    local_460 = uVar28;
    local_438 = uVar30;
    do {
      pVVar20 = local_418;
      iVar11 = clock_gettime(3,(timespec *)pVVar20);
      if (iVar11 < 0) {
        lVar26 = 1;
      }
      else {
        lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418[0].pArray),8);
        lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + local_418[0]._0_8_ * -1000000;
      }
      pGVar17 = (Gla_Man_t *)
                Gla_ManUnsatCore(pGVar14,(int)uVar28,pGVar14->pSat,pPars_00->nConfLimit,(int)in_R8,
                                 &local_470,&local_41c);
      if (local_470 == -1) {
LAB_005871bb:
        psVar5 = pGVar14->pSat;
        pPVar19 = psVar5->pPrf2;
        if (pPVar19 != (Prf_Man_t *)0x0) {
          pVVar20 = pPVar19->vSaved;
          if (pVVar20->pArray != (int *)0x0) {
            free(pVVar20->pArray);
            pVVar20->pArray = (int *)0x0;
          }
          if (pVVar20 != (Vec_Int_t *)0x0) {
            free(pVVar20);
          }
          pVVar22 = pPVar19->vInfo;
          if (pVVar22->pArray != (word *)0x0) {
            free(pVVar22->pArray);
            pVVar22->pArray = (word *)0x0;
          }
          if (pVVar22 != (Vec_Wrd_t *)0x0) {
            free(pVVar22);
          }
          free(pPVar19);
        }
        psVar5->pPrf2 = (Prf_Man_t *)0x0;
        uVar30 = local_438;
        goto LAB_005873af;
      }
      if (pGVar14->pSat->nRuntimeLimit != 0) {
        iVar11 = clock_gettime(3,(timespec *)pVVar20);
        if (iVar11 < 0) {
          lVar27 = -1;
        }
        else {
          lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
        }
        if (pGVar14->pSat->nRuntimeLimit < lVar27) goto LAB_005871bb;
      }
      if (local_470 == 1) {
        psVar5 = pGVar14->pSat;
        pPVar19 = psVar5->pPrf2;
        if (pPVar19 != (Prf_Man_t *)0x0) {
          pVVar20 = pPVar19->vSaved;
          if (pVVar20->pArray != (int *)0x0) {
            free(pVVar20->pArray);
            pVVar20->pArray = (int *)0x0;
          }
          if (pVVar20 != (Vec_Int_t *)0x0) {
            free(pVVar20);
          }
          pVVar22 = pPVar19->vInfo;
          if (pVVar22->pArray != (word *)0x0) {
            free(pVVar22->pArray);
            pVVar22->pArray = (word *)0x0;
          }
          if (pVVar22 != (Vec_Wrd_t *)0x0) {
            free(pVVar22);
          }
          free(pPVar19);
        }
        pVVar20 = local_418;
        psVar5->pPrf2 = (Prf_Man_t *)0x0;
        pGVar35 = (Gla_Man_t *)0x3;
        iVar32 = clock_gettime(3,(timespec *)pVVar20);
        iVar11 = (int)pVVar20;
        if (iVar32 < 0) {
          lVar27 = -1;
        }
        else {
          lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
        }
        pGVar14->timeUnsat = pGVar14->timeUnsat + lVar27 + lVar26;
        goto LAB_005873a5;
      }
      pGVar35 = (Gla_Man_t *)0x3;
      pVVar18 = pVVar20;
      iVar11 = clock_gettime(3,(timespec *)pVVar20);
      iVar32 = (int)pVVar18;
      if (iVar11 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      pGVar14->timeSat = pGVar14->timeSat + lVar27 + lVar26;
      if (local_470 != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x6cd,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      pGVar14->nCexes = pGVar14->nCexes + 1;
      iVar11 = Abc_FrameIsBridgeMode();
      if ((iVar11 != 0) && (local_454 != 0)) {
        Gia_GlaSendCancel(pGVar35,iVar32);
        local_454 = 0;
      }
      clock_gettime(3,(timespec *)pVVar20);
      if (pPars_00->fAddLayer == 0) {
        pGVar35 = pGVar14;
        pVVar18 = Gla_ManRefinement(pGVar14);
        iVar11 = (int)pVVar20;
        if (pVVar18 == (Vec_Int_t *)0x0) goto LAB_00587315;
      }
      else {
        pVVar18 = Gla_ManCollectPPis(pGVar14,pVVar20);
      }
      uVar28 = local_460;
      if (local_448 != (Abc_Cex_t *)0x0) {
        __assert_fail("pCex == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x6e8,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      psVar5 = pGVar14->pSat;
      if (local_46c == 0) {
        if (psVar5->qhead != psVar5->qtail) {
          __assert_fail("s->qhead == s->qtail",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.h"
                        ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
        }
        iVar11 = psVar5->size;
        psVar5->iVarPivot = iVar11;
        psVar5->iTrailPivot = psVar5->qhead;
        pVVar6 = psVar5->pPrf1;
        if (pVVar6 != (Vec_Set_t *)0x0) {
          psVar5->hProofPivot =
               (pVVar6->iPage << ((byte)pVVar6->nPageSize & 0x1f)) +
               (int)*pVVar6->pPages[pVVar6->iPage];
        }
        __dest = psVar5->activity2;
        *(undefined8 *)(psVar5->Mem).BookMarkE = *(undefined8 *)(psVar5->Mem).nEntries;
        iVar32 = (psVar5->Mem).iPage[0];
        bVar2 = (byte)(psVar5->Mem).nPageSize;
        ppiVar7 = (psVar5->Mem).pPages;
        (psVar5->Mem).BookMarkH[0] = iVar32 << (bVar2 & 0x1f) | *ppiVar7[iVar32];
        iVar32 = (psVar5->Mem).iPage[1];
        in_R8 = (uint *)ppiVar7[iVar32];
        (psVar5->Mem).BookMarkH[1] = iVar32 << (bVar2 & 0x1f) | *in_R8;
        if (__dest != (uint *)0x0) {
          psVar5->var_inc2 = psVar5->var_inc;
          memcpy(__dest,psVar5->activity,(long)iVar11 << 2);
        }
        pGVar14->vAddedNew->nSize = 0;
        pGVar14->nAbsOld = pGVar14->vAbs->nSize;
        psVar5 = pGVar14->pSat;
        if (psVar5->pPrf2 != (Prf_Man_t *)0x0) {
          __assert_fail("p->pSat->pPrf2 == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x6f7,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
        }
        local_430 = pGVar14->nSatVars;
        if (psVar5->pPrf1 == (Vec_Set_t *)0x0) {
          pPVar19 = (Prf_Man_t *)calloc(1,0x30);
          pPVar19->iFirst = -1;
          pPVar19->iFirst2 = -1;
          pVVar22 = (Vec_Wrd_t *)malloc(0x10);
          pVVar22->nCap = 1000;
          pVVar22->nSize = 0;
          pwVar23 = (word *)malloc(8000);
          pVVar22->pArray = pwVar23;
          pPVar19->vInfo = pVVar22;
          pVVar20 = (Vec_Int_t *)malloc(0x10);
          pVVar20->nCap = 1000;
          pVVar20->nSize = 0;
          piVar21 = (int *)malloc(4000);
          pVVar20->pArray = piVar21;
          pPVar19->vSaved = pVVar20;
          psVar5->pPrf2 = pPVar19;
          uVar28 = local_460;
        }
        uVar30 = local_438;
        if (psVar5->pPrf2 != (Prf_Man_t *)0x0) {
          pGVar14->nProofIds = 0;
          pVVar20 = pGVar14->vProofIds;
          uVar12 = pGVar14->pGia->nObjs;
          if (pVVar20->nCap < (int)uVar12) {
            if (pVVar20->pArray == (int *)0x0) {
              piVar21 = (int *)malloc((long)(int)uVar12 << 2);
            }
            else {
              piVar21 = (int *)realloc(pVVar20->pArray,(long)(int)uVar12 << 2);
            }
            pVVar20->pArray = piVar21;
            if (piVar21 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar20->nCap = uVar12;
          }
          if (0 < (int)uVar12) {
            memset(pVVar20->pArray,0xff,(ulong)uVar12 * 4);
          }
          pVVar20->nSize = uVar12;
          pPVar19 = local_428->pSat->pPrf2;
          if (pPVar19->iFirst != -1) {
            __assert_fail("p->iFirst == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
          }
          uVar12 = pVVar18->nSize;
          pVVar20 = local_428->vProofIds;
          pPVar19->iFirst = (local_428->pSat->stats).learnts;
          pPVar19->nWords = (((int)uVar12 >> 6) + 1) - (uint)((uVar12 & 0x3f) == 0);
          pPVar19->vId2Pr = pVVar20;
          pPVar19->pInfo = (word *)0x0;
          pPVar19->vInfo->nSize = 0;
          uVar30 = local_438;
          pGVar14 = local_428;
        }
      }
      else {
        pPVar19 = psVar5->pPrf2;
        pPars_00 = local_440;
        if (pPVar19 != (Prf_Man_t *)0x0) {
          if (pPVar19->iFirst < 0) {
            __assert_fail("p->iFirst >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          if (pPVar19->pInfo != (word *)0x0) {
            __assert_fail("p->pInfo == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          uVar12 = pVVar18->nSize + pGVar14->nProofIds;
          iVar11 = pPVar19->nWords;
          if (iVar11 * 0x40 <= (int)uVar12) {
            iVar32 = (((int)uVar12 >> 6) + 1) - (uint)((uVar12 & 0x3f) == 0);
            iVar29 = iVar11 * 2;
            if (iVar32 == iVar29 || SBORROW4(iVar32,iVar29) != iVar32 + iVar11 * -2 < 0) {
              iVar32 = iVar29;
            }
            uVar28 = (long)pPVar19->vInfo->nSize / (long)iVar11;
            local_468 = (double)(uVar28 & 0xffffffff);
            iVar11 = ((int)uVar28 + 1000) * iVar32;
            pVVar22 = (Vec_Wrd_t *)malloc(0x10);
            if (iVar11 - 1U < 0xf) {
              iVar11 = 0x10;
            }
            pVVar22->nSize = 0;
            pVVar22->nCap = iVar11;
            if (iVar11 == 0) {
              pwVar23 = (word *)0x0;
            }
            else {
              pwVar23 = (word *)malloc((long)iVar11 << 3);
            }
            pVVar22->pArray = pwVar23;
            if (0 < local_468._0_4_) {
              iVar11 = 0;
              do {
                uVar12 = pPVar19->nWords * iVar11;
                if (((int)uVar12 < 0) || (pPVar19->vInfo->nSize <= (int)uVar12)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                                ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                pPVar19->pInfo = pPVar19->vInfo->pArray + uVar12;
                lVar26 = 0;
                if (0 < pPVar19->nWords) {
                  do {
                    Vec_WrdPush(pVVar22,pPVar19->pInfo[lVar26]);
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < pPVar19->nWords);
                }
                iVar29 = iVar32 - (int)lVar26;
                if (iVar29 != 0 && (int)lVar26 <= iVar32) {
                  do {
                    Vec_WrdPush(pVVar22,0);
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 != local_468._0_4_);
            }
            __ptr = pPVar19->vInfo;
            if (__ptr->pArray != (word *)0x0) {
              free(__ptr->pArray);
              __ptr->pArray = (word *)0x0;
            }
            pGVar14 = local_428;
            if (__ptr != (Vec_Wrd_t *)0x0) {
              free(__ptr);
            }
            pPVar19->vInfo = pVVar22;
            pPVar19->nWords = iVar32;
            pPVar19->pInfo = (word *)0x0;
            uVar30 = local_438;
            uVar28 = local_460;
            pPars_00 = local_440;
          }
        }
      }
      Gia_GlaAddToAbs(pGVar14,pVVar18,1);
      Gia_GlaAddOneSlice(pGVar14,(int)uVar28,pVVar18);
      if (pVVar18->pArray != (int *)0x0) {
        free(pVVar18->pArray);
        pVVar18->pArray = (int *)0x0;
      }
      if (pVVar18 != (Vec_Int_t *)0x0) {
        free(pVVar18);
      }
      if (pGVar14->pPars->fVerbose != 0) {
        AVar9 = (pGVar14->pSat->stats).conflicts;
        iVar11 = clock_gettime(3,(timespec *)local_418);
        if (iVar11 < 0) {
          lVar26 = -1;
        }
        else {
          lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
        }
        in_R8 = (uint *)(ulong)local_46c;
        Gla_ManAbsPrintFrame
                  (pGVar14,-1,(int)uVar30,(int)AVar9 - local_42c,local_46c,lVar26 - local_478);
      }
      local_46c = local_46c + 1;
    } while( true );
  }
  uVar30 = 0;
  local_448 = (Abc_Cex_t *)0x0;
LAB_00587763:
  pAVar15 = local_448;
  iVar11 = pGVar14->pPars->fVerbose;
  if (local_448 != (Abc_Cex_t *)0x0) {
    if (iVar11 != 0) {
      putchar(10);
    }
    pGVar10 = local_450;
    if (local_450->pCexSeq != (Abc_Cex_t *)0x0) {
      free(local_450->pCexSeq);
      pGVar10->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar10->pCexSeq = pAVar15;
    local_458 = 0;
    pGVar36 = pGVar10;
    iVar11 = Gia_ManVerifyCex(pGVar10,pAVar15,0);
    iVar32 = (int)pGVar36;
    if (iVar11 == 0) {
      Abc_Print(iVar32,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar32,"Counter-example detected in frame %d.  ",uVar30 & 0xffffffff);
    pGVar36 = local_450;
    pGVar14->pPars->iFrame = pAVar15->iFrame + -1;
    if (pGVar10->vGateClasses != (Vec_Int_t *)0x0) {
      piVar21 = pGVar10->vGateClasses->pArray;
      if (piVar21 != (int *)0x0) {
        free(piVar21);
        pGVar36->vGateClasses->pArray = (int *)0x0;
      }
      if (pGVar36->vGateClasses != (Vec_Int_t *)0x0) {
        free(pGVar36->vGateClasses);
        pGVar36->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    goto LAB_00587ac1;
  }
  if ((iVar11 != 0) && (local_470 == -1)) {
    putchar(10);
  }
  pGVar10 = local_450;
  if (local_450->vGateClasses != (Vec_Int_t *)0x0) {
    piVar21 = local_450->vGateClasses->pArray;
    if (piVar21 != (int *)0x0) {
      free(piVar21);
      pGVar10->vGateClasses->pArray = (int *)0x0;
    }
    if (pGVar10->vGateClasses != (Vec_Int_t *)0x0) {
      free(pGVar10->vGateClasses);
      pGVar10->vGateClasses = (Vec_Int_t *)0x0;
    }
  }
  pGVar17 = pGVar14;
  pVVar20 = Gla_ManTranslate(pGVar14);
  iVar11 = (int)pGVar17;
  pGVar10->vGateClasses = pVVar20;
  pAVar16 = pGVar14->pPars;
  if (local_470 == -1) {
    if (pAVar16->nTimeOut == 0) {
LAB_00587a1d:
      uVar12 = pPars_00->nConfLimit;
      if ((uVar12 == 0) || ((int)(pGVar14->pSat->stats).conflicts < (int)uVar12)) {
        pGVar17 = pGVar14;
        iVar32 = Gia_GlaAbsCount(pGVar14,0,0);
        iVar11 = (int)pGVar17;
        uVar28 = (ulong)(uint)pPars_00->nRatioMin;
        if (iVar32 < ((100 - pPars_00->nRatioMin) * (pGVar14->nObjs + -1)) / 100) {
          Abc_Print(iVar11,"Abstraction stopped for unknown reason in frame %d.  ",
                    uVar30 & 0xffffffff);
          goto LAB_00587ac1;
        }
        pcVar34 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        uVar25 = uVar30 & 0xffffffff;
        goto LAB_005878da;
      }
      uVar13 = pGVar14->pPars->nFramesNoChange;
      pcVar34 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      iVar11 = 3;
      iVar32 = clock_gettime(3,(timespec *)local_418);
      if (iVar32 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      if (lVar26 < pGVar14->pSat->nRuntimeLimit) goto LAB_00587a1d;
      uVar12 = pGVar14->pPars->nTimeOut;
      uVar13 = pGVar14->pPars->nFramesNoChange;
      pcVar34 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar11,pcVar34,(ulong)uVar12,uVar30 & 0xffffffff,(ulong)uVar13);
  }
  else {
    pAVar16->iFrame = pAVar16->iFrame + 1;
    uVar25 = (ulong)(uint)pAVar16->nFramesNoChange;
    pcVar34 = "GLA completed %d frames with a %d-stable abstraction.  ";
    uVar28 = uVar30 & 0xffffffff;
LAB_005878da:
    Abc_Print(iVar11,pcVar34,uVar28,uVar25);
  }
LAB_00587ac1:
  iVar32 = 3;
  iVar11 = clock_gettime(3,(timespec *)local_418);
  if (iVar11 < 0) {
    lVar26 = -1;
  }
  else {
    lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
  }
  Abc_Print(iVar32,"%s =","Time");
  Abc_Print(iVar32,"%9.2f sec\n",(double)(lVar26 - local_478) / 1000000.0);
  if (pGVar14->pPars->fVerbose != 0) {
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    lVar27 = -1;
    lVar26 = -1;
    if (-1 < iVar11) {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    pGVar14->timeOther =
         lVar26 - (pGVar14->timeUnsat + local_478 + pGVar14->timeSat + pGVar14->timeCex +
                  pGVar14->timeInit);
    Abc_Print(iVar32,"%s =","Runtime: Initializing");
    lVar26 = pGVar14->timeInit;
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (-1 < iVar11) {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar27 != local_478) {
      local_468 = (double)pGVar14->timeInit * 100.0;
      iVar32 = 3;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar27 - local_478);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar26 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Solver UNSAT");
    lVar26 = pGVar14->timeUnsat;
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (iVar11 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar27 != local_478) {
      local_468 = (double)pGVar14->timeUnsat * 100.0;
      iVar32 = 3;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar27 - local_478);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar26 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Solver SAT  ");
    lVar26 = pGVar14->timeSat;
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (iVar11 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar27 != local_478) {
      local_468 = (double)pGVar14->timeSat * 100.0;
      iVar32 = 3;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar27 - local_478);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar26 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Refinement  ");
    lVar26 = pGVar14->timeCex;
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (iVar11 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar27 != local_478) {
      local_468 = (double)pGVar14->timeCex * 100.0;
      iVar32 = 3;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar27 - local_478);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar26 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Other       ");
    lVar26 = pGVar14->timeOther;
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (iVar11 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar27 != local_478) {
      local_468 = (double)pGVar14->timeOther * 100.0;
      iVar32 = 3;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar27 - local_478);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar26 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: TOTAL       ");
    iVar11 = clock_gettime(3,(timespec *)local_418);
    lVar27 = -1;
    lVar26 = -1;
    if (-1 < iVar11) {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    iVar32 = 3;
    iVar11 = clock_gettime(3,(timespec *)local_418);
    if (-1 < iVar11) {
      lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar27 != local_478) {
      iVar11 = clock_gettime(3,(timespec *)local_418);
      lVar31 = -1;
      lVar27 = -1;
      if (-1 < iVar11) {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      local_468 = (double)(lVar27 - local_478) * 100.0;
      iVar32 = 3;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (-1 < iVar11) {
        lVar31 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar31 - local_478);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)(lVar26 - local_478) / 1000000.0,dVar37);
    Gla_ManReportMemory(pGVar14);
  }
  Gla_ManStop(pGVar14);
  fflush(_stdout);
  return local_458;
LAB_00587315:
  psVar5 = pGVar14->pSat;
  pGVar33 = (Gla_Man_t *)psVar5->pPrf2;
  if (pGVar33 != (Gla_Man_t *)0x0) {
    __ptr_00 = pGVar33->pObjRoot;
    if (*(void **)__ptr_00->Fanins != (void *)0x0) {
      free(*(void **)__ptr_00->Fanins);
      __ptr_00->Fanins[0] = 0;
      __ptr_00->Fanins[1] = 0;
    }
    if (__ptr_00 != (Gla_Obj_t *)0x0) {
      free(__ptr_00);
    }
    pVVar20 = pGVar33->vAbs;
    if (pVVar20->pArray != (int *)0x0) {
      free(pVVar20->pArray);
      pVVar20->pArray = (int *)0x0;
    }
    if (pVVar20 != (Vec_Int_t *)0x0) {
      free(pVVar20);
    }
    free(pGVar33);
    pGVar35 = pGVar33;
  }
  psVar5->pPrf2 = (Prf_Man_t *)0x0;
  local_448 = pGVar14->pGia->pCexSeq;
  pGVar14->pGia->pCexSeq = (Abc_Cex_t *)0x0;
LAB_005873a5:
  uVar30 = local_438;
  if (local_448 == (Abc_Cex_t *)0x0) {
    if (local_470 != 1) {
      __assert_fail("Status == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x712,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
    }
    if (pGVar17 == (Gla_Man_t *)0x0) {
      iVar32 = 1;
    }
    else {
      iVar32 = *(int *)((long)&pGVar17->pGia0 + 4) + 1;
      pGVar33 = pGVar17;
      pGVar35 = pGVar14;
      Gia_GlaAddToCounters(pGVar14,(Vec_Int_t *)pGVar17);
      iVar11 = (int)pGVar33;
    }
    if (local_46c == 0) {
      piVar21 = &pGVar14->pPars->nFramesNoChange;
      *piVar21 = *piVar21 + 1;
      if (pGVar17 != (Gla_Man_t *)0x0) {
        if (pGVar17->pGia != (Gia_Man_t *)0x0) {
          free(pGVar17->pGia);
          pGVar17->pGia = (Gia_Man_t *)0x0;
        }
        free(pGVar17);
        pGVar35 = pGVar17;
      }
    }
    else {
      pGVar14->pPars->nFramesNoChange = 0;
      sat_solver2_rollback(pGVar14->pSat);
      Gla_ManRollBack(pGVar14);
      pGVar14->nSatVars = local_430;
      Gia_GlaAddToAbs(pGVar14,(Vec_Int_t *)pGVar17,0);
      Gia_GlaAddOneSlice(pGVar14,(int)local_460,(Vec_Int_t *)pGVar17);
      if (pGVar17->pGia != (Gia_Man_t *)0x0) {
        free(pGVar17->pGia);
        pGVar17->pGia = (Gia_Man_t *)0x0;
      }
      if (pGVar17 != (Gla_Man_t *)0x0) {
        free(pGVar17);
      }
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar26 = 1;
      }
      else {
        lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418[0].pArray),8);
        lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + local_418[0]._0_8_ * -1000000;
      }
      pGVar17 = (Gla_Man_t *)
                Gla_ManUnsatCore(pGVar14,(int)local_460,pGVar14->pSat,pPars_00->nConfLimit,
                                 (int)in_R8,&local_470,&local_41c);
      pGVar35 = (Gla_Man_t *)0x3;
      pVVar20 = local_418;
      iVar29 = clock_gettime(3,(timespec *)pVVar20);
      iVar11 = (int)pVVar20;
      if (iVar29 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      pGVar14->timeUnsat = pGVar14->timeUnsat + lVar27 + lVar26;
      if (pGVar17 != (Gla_Man_t *)0x0) {
        if (pGVar17->pGia != (Gia_Man_t *)0x0) {
          free(pGVar17->pGia);
          pGVar17->pGia = (Gia_Man_t *)0x0;
        }
        free(pGVar17);
        pGVar35 = pGVar17;
      }
      if (local_470 == -1) {
        local_448 = (Abc_Cex_t *)0x0;
        goto LAB_005873af;
      }
      if (local_470 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x738,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
    }
    uVar28 = local_460;
    if (pGVar14->pPars->fVerbose != 0) {
      AVar9 = (pGVar14->pSat->stats).conflicts;
      iVar11 = clock_gettime(3,(timespec *)local_418);
      if (iVar11 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      in_R8 = (uint *)(ulong)local_46c;
      pGVar35 = pGVar14;
      iVar11 = iVar32;
      Gla_ManAbsPrintFrame
                (pGVar14,iVar32,(int)uVar30,(int)AVar9 - local_42c,local_46c,lVar26 - local_478);
    }
    if ((local_420 != 0 && 2 < (uint)uVar28) && local_46c == 0) {
      iVar32 = Abc_FrameIsBridgeMode();
      if (iVar32 != 0) {
        if (local_454 != 0) {
          Gia_GlaSendCancel(pGVar35,iVar11);
        }
        Gia_GlaSendAbsracted(pGVar14,iVar11);
        local_454 = 1;
      }
      if (pGVar14->pPars->fDumpVabs != 0) {
        Abc_FrameSetStatus(-1);
        Abc_FrameSetCex((Abc_Cex_t *)0x0);
        Abc_FrameSetNFrames((int)uVar30);
        pcVar34 = pGVar14->pPars->pFileVabs;
        if (pcVar34 == (char *)0x0) {
          pcVar34 = "glabs.aig";
        }
        pcVar34 = Extra_FileNameGenericAppend(pcVar34,".status");
        sprintf((char *)local_418,"write_status %s",pcVar34);
        pAbc = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAbc,(char *)local_418);
        Gia_GlaDumpAbsracted(pGVar14,pPars_00->fVerbose);
      }
    }
    iVar11 = Gia_GlaAbsCount(pGVar14,0,0);
    bVar8 = ((100 - pPars_00->nRatioMin) * (pGVar14->nObjs + -1)) / 100 <= iVar11;
    if (bVar8) {
      local_470 = -1;
    }
    bVar8 = !bVar8;
    local_448 = (Abc_Cex_t *)0x0;
  }
  else {
LAB_005873af:
    bVar8 = false;
    uVar28 = local_460;
  }
  if (!bVar8) {
    uVar30 = uVar28 & 0xffffffff;
    goto LAB_00587763;
  }
  pAVar16 = pGVar14->pPars;
  uVar28 = uVar30 & 0xffffffff;
  uVar12 = local_46c;
  if (pAVar16->nFramesMax <= (int)uVar30 && pAVar16->nFramesMax != 0) goto LAB_00587763;
  goto LAB_00586b1e;
}

Assistant:

int Gia_ManPerformGlaOld( Gia_Man_t * pAig, Abs_Par_t * pPars, int fStartVta )
{
    extern int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars );
    extern void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN );
    Gla_Man_t * p;
    Vec_Int_t * vPPis, * vCore;//, * vCore2 = NULL;
    Abc_Cex_t * pCex = NULL;
    int f, i, iPrev, nConfls, Status, nVarsOld = 0, nCoreSize, fOneIsSent = 0, RetValue = -1;
    abctime clk2, clk = Abc_Clock();
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vGateClasses == NULL )
    {
        if ( fStartVta )
        {
            int nFramesMaxOld   = pPars->nFramesMax;
            int nFramesStartOld = pPars->nFramesStart;
            int nTimeOutOld     = pPars->nTimeOut;
            int nDumpOld        = pPars->fDumpVabs;
            pPars->nFramesMax   = pPars->nFramesStart;
            pPars->nFramesStart = Abc_MinInt( pPars->nFramesStart/2 + 1, 3 );
            pPars->nTimeOut     = 20;
            pPars->fDumpVabs    = 0;
            RetValue = Gia_VtaPerformInt( pAig, pPars );
            pPars->nFramesMax   = nFramesMaxOld;
            pPars->nFramesStart = nFramesStartOld;
            pPars->nTimeOut     = nTimeOutOld;
            pPars->fDumpVabs    = nDumpOld;
            // create gate classes
            Vec_IntFreeP( &pAig->vGateClasses );
            if ( pAig->vObjClasses )
                pAig->vGateClasses = Gia_VtaConvertToGla( pAig, pAig->vObjClasses );
            Vec_IntFreeP( &pAig->vObjClasses );
            // return if VTA solve the problem if could not start
            if ( RetValue == 0 || pAig->vGateClasses == NULL )
                return RetValue;
        }
        else
        {
            pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
            Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
            Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
        }
    }
    // start the manager
    p = Gla_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    for ( f = i = iPrev = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++, iPrev = i )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;

        // load timeframe
        Gia_GlaAddTimeFrame( p, f );

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
//            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 || (p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit) ) // resource limit is reached
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
//                if ( Gia_ManRegNum(p->pGia) > 1 ) // for comb cases, return the abstraction
//                    Vec_IntShrink( p->vAbs, p->nAbsOld );
                goto finish;
            }
            if ( Status == 1 )
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            } 
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;

            // cancel old one if it was sent
            if ( Abc_FrameIsBridgeMode() && fOneIsSent )
            {
                Gia_GlaSendCancel( p, pPars->fVerbose );
                fOneIsSent = 0;
            }

            // perform the refinement
            clk2 = Abc_Clock();
            if ( pPars->fAddLayer )
            {
                vPPis = Gla_ManCollectPPis( p, NULL );
//                Gla_ManExplorePPis( p, vPPis );
            }
            else
            {
                vPPis = Gla_ManRefinement( p );
                if ( vPPis == NULL )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    pCex = p->pGia->pCexSeq; p->pGia->pCexSeq = NULL;
                    break;
                }
            } 
            assert( pCex == NULL );

            // start proof logging
            if ( i == 0 )
            {
                // create bookmark to be used for rollback
                sat_solver2_bookmark( p->pSat );
                Vec_IntClear( p->vAddedNew );
                p->nAbsOld = Vec_IntSize( p->vAbs );
                nVarsOld = p->nSatVars;
//                p->nLrnOld = sat_solver2_nlearnts( p->pSat );
//                p->nAbsNew = 0;
//                p->nLrnNew = 0;

                // start incremental proof manager
                assert( p->pSat->pPrf2 == NULL );
                if ( p->pSat->pPrf1 == NULL )
                    p->pSat->pPrf2 = Prf_ManAlloc();
                if ( p->pSat->pPrf2 )
                {
                    p->nProofIds = 0;
                    Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                    Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                }
            }
            else
            {
                // resize the proof logger
                if ( p->pSat->pPrf2 )
                    Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
            }

            Gia_GlaAddToAbs( p, vPPis, 1 );
            Gia_GlaAddOneSlice( p, f, vPPis );
            Vec_IntFree( vPPis );

            // print the result (do not count it towards change)
            if ( p->pPars->fVerbose )
            Gla_ManAbsPrintFrame( p, -1, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );
        }
        if ( pCex != NULL )
            break;
        assert( Status == 1 );

        // valid core is obtained
        nCoreSize = 1;
        if ( vCore )
        {
            nCoreSize += Vec_IntSize( vCore );
            Gia_GlaAddToCounters( p, vCore );
        }
        if ( i == 0 )
        {
            p->pPars->nFramesNoChange++;
            Vec_IntFreeP( &vCore );
        }
        else
        {
            p->pPars->nFramesNoChange = 0;
//            p->nAbsNew = Vec_IntSize( p->vAbs ) - p->nAbsOld;
//            p->nLrnNew = Abc_AbsInt( sat_solver2_nlearnts( p->pSat ) - p->nLrnOld );
            // update the SAT solver
            sat_solver2_rollback( p->pSat );
            // update storage
            Gla_ManRollBack( p );
            p->nSatVars = nVarsOld;
            // load this timeframe
            Gia_GlaAddToAbs( p, vCore, 0 );
            Gia_GlaAddOneSlice( p, f, vCore );
            Vec_IntFree( vCore );
            // run SAT solver
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
            p->timeUnsat += Abc_Clock() - clk2;
//            assert( (vCore != NULL) == (Status == 1) );
            Vec_IntFreeP( &vCore );
            if ( Status == -1 ) // resource limit is reached
                break;
            if ( Status == 0 )
            {
                assert( 0 );
    //            Vta_ManSatVerify( p );
                // make sure, there was no initial abstraction (otherwise, it was invalid)
                assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
    //            pCex = Vga_ManDeriveCex( p );
                break;
            }
        }
        // print the result
        if ( p->pPars->fVerbose )
        Gla_ManAbsPrintFrame( p, nCoreSize, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );

        if ( f > 2 && iPrev > 0 && i == 0 ) // change has happened
        {
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_GlaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_GlaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }

            // dump the model into file
            if ( p->pPars->fDumpVabs )
            {
                char Command[1000];
                Abc_FrameSetStatus( -1 );
                Abc_FrameSetCex( NULL );
                Abc_FrameSetNFrames( f+1 );
                sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status") );
                Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                Gia_GlaDumpAbsracted( p, pPars->fVerbose );
            }
        }

        // check if the number of objects is below limit
        if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
//        if ( pAig->vGateClasses != NULL )
//            Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Gla_ManTranslate( p );
        if ( Status == -1 )
        {
            if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
            else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
            else if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
                Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
            else
                Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
        }
        else
        {
            p->pPars->iFrame++;
            Abc_Print( 1, "GLA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( pAig, pCex, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gla_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( pAig, p->pPars, p->pSat, p->pPars->iFrame, 1 );
    Gla_ManStop( p );
    fflush( stdout );
    return RetValue;
}